

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  uint uVar1;
  Schema SVar2;
  bool bVar3;
  ulong uVar4;
  uint64_t id;
  unsigned_long i;
  long lVar5;
  bool bVar6;
  Schema local_c0;
  Reader superclasses;
  Fault f;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint64_t *local_78;
  WirePointer *local_70;
  uint local_68;
  ushort local_64;
  int local_60;
  PointerReader local_58;
  
  uVar1 = *counter;
  *counter = uVar1 + 1;
  superclasses.reader.segment = (SegmentReader *)CONCAT44(superclasses.reader.segment._4_4_,uVar1);
  superclasses.reader.capTable = (CapTableReader *)&MAX_SUPERCLASSES;
  superclasses.reader.ptr = " < ";
  superclasses.reader.elementCount = 4;
  superclasses.reader.step = 0;
  superclasses.reader.structDataSize._0_1_ = uVar1 < 0x40;
  if ((bool)(undefined1)superclasses.reader.structDataSize) {
    SVar2.raw = (this->super_Schema).raw;
    if ((Schema)SVar2.raw == other.super_Schema.raw) {
      bVar3 = true;
    }
    else {
      superclasses.reader.ptr = (byte *)(SVar2.raw)->generic->encodedNode;
      superclasses.reader.segment = (SegmentReader *)0x0;
      superclasses.reader.capTable = (CapTableReader *)0x0;
      superclasses.reader.elementCount = 0x7fffffff;
      superclasses.reader.step = 0;
      bVar3 = false;
      _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&superclasses,(word *)0x0);
      local_58.pointer = local_70 + 4;
      if (local_64 < 5) {
        f.exception._0_4_ = 0;
        f.exception._4_4_ = 0;
        uStack_80 = 0;
        uStack_7c = 0;
        local_60 = 0x7fffffff;
        local_58.pointer = (WirePointer *)0x0;
      }
      local_58.segment = (SegmentReader *)CONCAT44(f.exception._4_4_,f.exception._0_4_);
      local_58.capTable._0_4_ = uStack_80;
      local_58.capTable._4_4_ = uStack_7c;
      local_58.nestingLimit = local_60;
      _::PointerReader::getList(&superclasses.reader,&local_58,INLINE_COMPOSITE,(word *)0x0);
      uVar4 = superclasses.reader._24_8_ & 0xffffffff;
      if (uVar4 != 0) {
        lVar5 = 0;
        do {
          _::ListReader::getStructElement
                    ((StructReader *)&f,&superclasses.reader,(ElementCount)lVar5);
          if (local_68 < 0x40) {
            id = 0;
          }
          else {
            id = *local_78;
          }
          local_c0 = Schema::getDependency(&this->super_Schema,id,(ElementCount)lVar5 | 0x4000000);
          local_58.segment = (SegmentReader *)Schema::asInterface(&local_c0);
          bVar3 = extends((InterfaceSchema *)&local_58,other,counter);
        } while ((!bVar3) && (bVar6 = uVar4 - 1 != lVar5, lVar5 = lVar5 + 1, bVar6));
      }
    }
  }
  else {
    bVar3 = false;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x27f,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)&superclasses,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return bVar3;
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}